

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

void Bac_ManAssignInternWordNames(Bac_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vMap_00;
  Bac_Ntk_t *p_00;
  int local_24;
  int i;
  Bac_Ntk_t *pNtk;
  Vec_Int_t *vMap;
  Bac_Man_t *p_local;
  
  iVar1 = Bac_ManObjNum(p);
  vMap_00 = Vec_IntStart(iVar1 << 1);
  for (local_24 = 1; iVar1 = Bac_ManNtkNum(p), local_24 <= iVar1; local_24 = local_24 + 1) {
    p_00 = Bac_ManNtk(p,local_24);
    Bac_ManAssignInternWordNamesNtk(p_00,vMap_00);
  }
  iVar1 = Vec_IntCountEntry(vMap_00,0);
  iVar2 = Vec_IntSize(vMap_00);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntCountEntry(vMap, 0) == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0x18e,"void Bac_ManAssignInternWordNames(Bac_Man_t *)");
  }
  Vec_IntFree(vMap_00);
  return;
}

Assistant:

void Bac_ManAssignInternWordNames( Bac_Man_t * p )
{
    Vec_Int_t * vMap = Vec_IntStart( 2*Bac_ManObjNum(p) );
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManAssignInternWordNamesNtk( pNtk, vMap );
    assert( Vec_IntCountEntry(vMap, 0) == Vec_IntSize(vMap) );
    Vec_IntFree( vMap );
}